

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86.cpp
# Opt level: O2

int __thiscall
ncnn::GroupNorm_x86::forward_inplace(GroupNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int q_1;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  float *pfVar15;
  float *pfVar16;
  float *gamma;
  float *pfVar17;
  int q;
  long lVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  float *beta;
  long lVar27;
  long lVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  
  iVar19 = bottom_top_blob->dims;
  iVar22 = (this->super_GroupNorm).group;
  uVar12 = (long)(this->super_GroupNorm).channels / (long)iVar22;
  iVar9 = (int)uVar12;
  lVar18 = (long)iVar9;
  if (iVar19 == 2) {
    iVar19 = bottom_top_blob->w;
    iVar13 = iVar19 * iVar9;
    lVar10 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    for (lVar14 = 0; lVar14 < iVar22; lVar14 = lVar14 + 1) {
      lVar23 = lVar14 * lVar18;
      pvVar2 = bottom_top_blob->data;
      pfVar17 = (float *)(lVar23 * bottom_top_blob->w * bottom_top_blob->elemsize + (long)pvVar2);
      fVar29 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
      lVar26 = 0;
      pfVar15 = pfVar17;
      for (iVar22 = 0; iVar22 + 3 < iVar13; iVar22 = iVar22 + 4) {
        fVar29 = fVar29 + *pfVar15;
        fVar30 = fVar30 + pfVar15[1];
        fVar31 = fVar31 + pfVar15[2];
        fVar32 = fVar32 + pfVar15[3];
        pfVar15 = pfVar15 + 4;
        lVar26 = lVar26 + 4;
      }
      pfVar15 = (float *)((long)(this->super_GroupNorm).gamma_data.data +
                         (this->super_GroupNorm).gamma_data.elemsize * lVar23);
      fVar29 = fVar32 + fVar30 + fVar31 + fVar29;
      lVar24 = bottom_top_blob->elemsize * lVar10 * (long)bottom_top_blob->w;
      for (; (int)lVar26 < iVar13; lVar26 = lVar26 + 1) {
        fVar29 = fVar29 + *(float *)((long)pvVar2 + lVar26 * 4 + lVar24);
      }
      fVar29 = fVar29 * (1.0 / (float)iVar13);
      lVar26 = 0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
      fVar33 = 0.0;
      pfVar16 = pfVar17;
      for (iVar22 = 0; iVar22 + 3 < iVar13; iVar22 = iVar22 + 4) {
        fVar30 = fVar30 + (*pfVar16 - fVar29) * (*pfVar16 - fVar29);
        fVar31 = fVar31 + (pfVar16[1] - fVar29) * (pfVar16[1] - fVar29);
        fVar32 = fVar32 + (pfVar16[2] - fVar29) * (pfVar16[2] - fVar29);
        fVar33 = fVar33 + (pfVar16[3] - fVar29) * (pfVar16[3] - fVar29);
        pfVar16 = pfVar16 + 4;
        lVar26 = lVar26 + 4;
      }
      fVar30 = fVar33 + fVar31 + fVar32 + fVar30;
      for (; (int)lVar26 < iVar13; lVar26 = lVar26 + 1) {
        fVar31 = *(float *)((long)pvVar2 + lVar26 * 4 + lVar24) - fVar29;
        fVar30 = fVar30 + fVar31 * fVar31;
      }
      fVar30 = 1.0 / SQRT(fVar30 * (1.0 / (float)iVar13) + (this->super_GroupNorm).eps);
      fVar29 = -fVar29 * fVar30;
      if ((this->super_GroupNorm).affine == 0) {
        lVar23 = 0;
        for (iVar22 = 0; iVar22 + 3 < iVar13; iVar22 = iVar22 + 4) {
          *pfVar17 = *pfVar17 * fVar30 + fVar29;
          pfVar17[1] = pfVar17[1] * fVar30 + fVar29;
          pfVar17[2] = pfVar17[2] * fVar30 + fVar29;
          pfVar17[3] = pfVar17[3] * fVar30 + fVar29;
          pfVar17 = pfVar17 + 4;
          lVar23 = lVar23 + 4;
        }
        for (; (int)lVar23 < iVar13; lVar23 = lVar23 + 1) {
          *(float *)((long)pvVar2 + lVar23 * 4 + lVar24) =
               *(float *)((long)pvVar2 + lVar23 * 4 + lVar24) * fVar30 + fVar29;
        }
      }
      else {
        pfVar16 = (float *)((long)(this->super_GroupNorm).beta_data.data +
                           lVar23 * (this->super_GroupNorm).beta_data.elemsize);
        for (iVar22 = 0; iVar22 != iVar9; iVar22 = iVar22 + 1) {
          fVar32 = *pfVar15 * fVar30;
          fVar31 = *pfVar15 * fVar29 + *pfVar16;
          for (iVar21 = 0; iVar21 + 3 < iVar19; iVar21 = iVar21 + 4) {
            *pfVar17 = *pfVar17 * fVar32 + fVar31;
            pfVar17[1] = pfVar17[1] * fVar32 + fVar31;
            pfVar17[2] = pfVar17[2] * fVar32 + fVar31;
            pfVar17[3] = pfVar17[3] * fVar32 + fVar31;
            pfVar17 = pfVar17 + 4;
          }
          for (; iVar21 < iVar19; iVar21 = iVar21 + 1) {
            *pfVar17 = *pfVar17 * fVar32 + fVar31;
            pfVar17 = pfVar17 + 1;
          }
          pfVar15 = pfVar15 + 1;
          pfVar16 = pfVar16 + 1;
        }
      }
      iVar22 = (this->super_GroupNorm).group;
      lVar10 = lVar10 + lVar18;
    }
  }
  else if (iVar19 == 1) {
    lVar10 = 0;
    for (lVar14 = 0; lVar14 < iVar22; lVar14 = lVar14 + 1) {
      pvVar2 = bottom_top_blob->data;
      pfVar17 = (float *)(lVar14 * lVar18 * bottom_top_blob->elemsize + (long)pvVar2);
      pvVar3 = (this->super_GroupNorm).gamma_data.data;
      pvVar4 = (this->super_GroupNorm).beta_data.data;
      lVar23 = 0;
      fVar29 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
      pfVar15 = pfVar17;
      for (iVar19 = 0; iVar19 + 3 < iVar9; iVar19 = iVar19 + 4) {
        fVar29 = fVar29 + *pfVar15;
        fVar30 = fVar30 + pfVar15[1];
        fVar31 = fVar31 + pfVar15[2];
        fVar32 = fVar32 + pfVar15[3];
        pfVar15 = pfVar15 + 4;
        lVar23 = lVar23 + 4;
      }
      fVar29 = fVar32 + fVar30 + fVar31 + fVar29;
      lVar26 = bottom_top_blob->elemsize * lVar10;
      for (; (int)lVar23 < iVar9; lVar23 = lVar23 + 1) {
        fVar29 = fVar29 + *(float *)((long)pvVar2 + lVar23 * 4 + lVar26);
      }
      fVar29 = fVar29 * (1.0 / (float)iVar9);
      lVar23 = 0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
      fVar33 = 0.0;
      pfVar15 = pfVar17;
      for (iVar19 = 0; iVar19 + 3 < iVar9; iVar19 = iVar19 + 4) {
        fVar30 = fVar30 + (*pfVar15 - fVar29) * (*pfVar15 - fVar29);
        fVar31 = fVar31 + (pfVar15[1] - fVar29) * (pfVar15[1] - fVar29);
        fVar32 = fVar32 + (pfVar15[2] - fVar29) * (pfVar15[2] - fVar29);
        fVar33 = fVar33 + (pfVar15[3] - fVar29) * (pfVar15[3] - fVar29);
        pfVar15 = pfVar15 + 4;
        lVar23 = lVar23 + 4;
      }
      fVar30 = fVar33 + fVar31 + fVar32 + fVar30;
      for (; (int)lVar23 < iVar9; lVar23 = lVar23 + 1) {
        fVar31 = *(float *)((long)pvVar2 + lVar23 * 4 + lVar26) - fVar29;
        fVar30 = fVar30 + fVar31 * fVar31;
      }
      fVar30 = 1.0 / SQRT(fVar30 * (1.0 / (float)iVar9) + (this->super_GroupNorm).eps);
      fVar29 = -fVar29 * fVar30;
      if ((this->super_GroupNorm).affine == 0) {
        lVar23 = 0;
        for (iVar19 = 0; iVar19 + 3 < iVar9; iVar19 = iVar19 + 4) {
          *pfVar17 = *pfVar17 * fVar30 + fVar29;
          pfVar17[1] = pfVar17[1] * fVar30 + fVar29;
          pfVar17[2] = pfVar17[2] * fVar30 + fVar29;
          pfVar17[3] = pfVar17[3] * fVar30 + fVar29;
          pfVar17 = pfVar17 + 4;
          lVar23 = lVar23 + 4;
        }
        for (; (int)lVar23 < iVar9; lVar23 = lVar23 + 1) {
          *(float *)((long)pvVar2 + lVar23 * 4 + lVar26) =
               *(float *)((long)pvVar2 + lVar23 * 4 + lVar26) * fVar30 + fVar29;
        }
      }
      else {
        lVar28 = (this->super_GroupNorm).beta_data.elemsize * lVar10;
        lVar27 = (this->super_GroupNorm).gamma_data.elemsize * lVar10;
        lVar24 = 0;
        lVar23 = 0;
        for (iVar19 = 0; iVar19 + 3 < iVar9; iVar19 = iVar19 + 4) {
          pfVar15 = (float *)((long)pvVar3 + lVar23 + lVar27);
          fVar31 = pfVar15[1];
          fVar32 = pfVar15[2];
          fVar33 = pfVar15[3];
          pfVar17 = (float *)((long)pvVar4 + lVar23 + lVar28);
          fVar34 = pfVar17[1];
          fVar35 = pfVar17[2];
          fVar5 = pfVar17[3];
          pfVar16 = (float *)((long)pvVar2 + lVar23 + lVar26);
          fVar6 = pfVar16[1];
          fVar7 = pfVar16[2];
          fVar8 = pfVar16[3];
          pfVar1 = (float *)((long)pvVar2 + lVar23 + lVar26);
          *pfVar1 = (*pfVar16 * fVar30 + fVar29) * *pfVar15 + *pfVar17;
          pfVar1[1] = (fVar6 * fVar30 + fVar29) * fVar31 + fVar34;
          pfVar1[2] = (fVar7 * fVar30 + fVar29) * fVar32 + fVar35;
          pfVar1[3] = (fVar8 * fVar30 + fVar29) * fVar33 + fVar5;
          lVar23 = lVar23 + 0x10;
          lVar24 = lVar24 + 4;
        }
        for (; (int)lVar24 < iVar9; lVar24 = lVar24 + 1) {
          *(float *)((long)pvVar2 + lVar24 * 4 + lVar26) =
               (*(float *)((long)pvVar2 + lVar24 * 4 + lVar26) * fVar30 + fVar29) *
               *(float *)((long)pvVar3 + lVar24 * 4 + lVar27) +
               *(float *)((long)pvVar4 + lVar24 * 4 + lVar28);
        }
      }
      iVar22 = (this->super_GroupNorm).group;
      lVar10 = lVar10 + lVar18;
    }
  }
  else if (iVar19 - 3U < 2) {
    iVar19 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar25 = 0;
    uVar12 = uVar12 & 0xffffffff;
    if (iVar9 < 1) {
      uVar12 = uVar25;
    }
    fVar29 = 1.0 / (float)(iVar19 * iVar9);
    for (; (long)uVar25 < (long)iVar22; uVar25 = uVar25 + 1) {
      lVar23 = uVar25 * lVar18;
      uVar11 = bottom_top_blob->elemsize;
      lVar10 = bottom_top_blob->cstep * lVar23 * uVar11;
      pvVar2 = bottom_top_blob->data;
      uVar20 = (long)bottom_top_blob->d * uVar11 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0;
      lVar14 = uVar20 - uVar20 % uVar11;
      fVar30 = 0.0;
      for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        pfVar15 = (float *)((long)pvVar2 + lVar14 * uVar11 + lVar10);
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        for (iVar22 = 0; iVar22 + 3 < iVar19; iVar22 = iVar22 + 4) {
          fVar31 = fVar31 + *pfVar15;
          fVar32 = fVar32 + pfVar15[1];
          fVar33 = fVar33 + pfVar15[2];
          fVar34 = fVar34 + pfVar15[3];
          pfVar15 = pfVar15 + 4;
        }
        fVar30 = fVar30 + fVar33 + fVar31 + fVar34 + fVar32;
        for (; iVar22 < iVar19; iVar22 = iVar22 + 1) {
          fVar30 = fVar30 + *pfVar15;
          pfVar15 = pfVar15 + 1;
        }
      }
      pfVar15 = (float *)((long)(this->super_GroupNorm).gamma_data.data +
                         (this->super_GroupNorm).gamma_data.elemsize * lVar23);
      fVar30 = fVar30 * fVar29;
      fVar31 = 0.0;
      for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        pfVar17 = (float *)((long)pvVar2 + lVar14 * uVar11 + lVar10);
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        for (iVar22 = 0; iVar22 + 3 < iVar19; iVar22 = iVar22 + 4) {
          fVar32 = fVar32 + (*pfVar17 - fVar30) * (*pfVar17 - fVar30);
          fVar33 = fVar33 + (pfVar17[1] - fVar30) * (pfVar17[1] - fVar30);
          fVar34 = fVar34 + (pfVar17[2] - fVar30) * (pfVar17[2] - fVar30);
          fVar35 = fVar35 + (pfVar17[3] - fVar30) * (pfVar17[3] - fVar30);
          pfVar17 = pfVar17 + 4;
        }
        fVar31 = fVar31 + fVar34 + fVar32 + fVar35 + fVar33;
        for (; iVar22 < iVar19; iVar22 = iVar22 + 1) {
          fVar31 = fVar31 + (*pfVar17 - fVar30) * (*pfVar17 - fVar30);
          pfVar17 = pfVar17 + 1;
        }
      }
      pfVar17 = (float *)((long)(this->super_GroupNorm).beta_data.data +
                         lVar23 * (this->super_GroupNorm).beta_data.elemsize);
      fVar31 = 1.0 / SQRT(fVar31 * fVar29 + (this->super_GroupNorm).eps);
      for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        fVar32 = -fVar30 * fVar31;
        fVar33 = fVar31;
        if ((this->super_GroupNorm).affine != 0) {
          fVar33 = *pfVar15 * fVar31;
          fVar32 = *pfVar15 * -fVar30 * fVar31 + *pfVar17;
        }
        pfVar16 = (float *)((long)pvVar2 + lVar14 * uVar11 + lVar10);
        for (iVar22 = 0; iVar22 + 3 < iVar19; iVar22 = iVar22 + 4) {
          *pfVar16 = *pfVar16 * fVar33 + fVar32;
          pfVar16[1] = pfVar16[1] * fVar33 + fVar32;
          pfVar16[2] = pfVar16[2] * fVar33 + fVar32;
          pfVar16[3] = pfVar16[3] * fVar33 + fVar32;
          pfVar16 = pfVar16 + 4;
        }
        for (; iVar22 < iVar19; iVar22 = iVar22 + 1) {
          *pfVar16 = *pfVar16 * fVar33 + fVar32;
          pfVar16 = pfVar16 + 1;
        }
        pfVar15 = pfVar15 + 1;
        pfVar17 = pfVar17 + 1;
      }
      iVar22 = (this->super_GroupNorm).group;
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}